

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

istream * Json::operator>>(istream *sin,Value *root)

{
  bool bVar1;
  string errs;
  CharReaderBuilder b;
  string local_68;
  CharReaderBuilder local_48;
  
  CharReaderBuilder::CharReaderBuilder(&local_48);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  bVar1 = parseFromStream(&local_48.super_Factory,sin,root,&local_68);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_68);
    CharReaderBuilder::~CharReaderBuilder(&local_48);
    return sin;
  }
  fprintf(_stderr,"Error from reader: %s",local_68._M_dataplus._M_p);
  throwRuntimeError(&local_68);
}

Assistant:

JSONCPP_ISTREAM& operator>>(JSONCPP_ISTREAM& sin, Value& root) {
  CharReaderBuilder b;
  JSONCPP_STRING errs;
  bool ok = parseFromStream(b, sin, &root, &errs);
  if (!ok) {
    fprintf(stderr,
            "Error from reader: %s",
            errs.c_str());

    throwRuntimeError(errs);
  }
  return sin;
}